

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval.cc
# Opt level: O2

bool tinyusdz::tydra::anon_unknown_1::ToTerminalAttributeValue
               (Attribute *attr,TerminalAttributeValue *value,string *err,double t,
               TimeSampleInterpolationType tinterp)

{
  PrimVar *this;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  Value *v;
  storage_union local_1d8;
  undefined **local_1c8;
  ostringstream ss_e;
  
  if (value == (TerminalAttributeValue *)0x0) {
    return false;
  }
  bVar1 = Attribute::is_blocked(attr);
  if (bVar1) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ToTerminalAttributeValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x20);
    ::std::operator<<(poVar2," ");
    pcVar3 = "Attribute is None(Value Blocked).";
  }
  else {
    this = &attr->_var;
    AttrMetas::operator=(&value->_meta,&attr->_metas);
    value->_variability = attr->_variability;
    bVar1 = primvar::PrimVar::is_valid(this);
    if (bVar1) {
      bVar1 = primvar::PrimVar::is_scalar(this);
      if (bVar1) {
        TerminalAttributeValue::set_value(value,&this->_value);
        return true;
      }
      bVar1 = primvar::PrimVar::is_timesamples(this);
      if (bVar1) {
        local_1c8 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_1d8.dynamic = (void *)0x0;
        bVar1 = primvar::PrimVar::get_interpolated_value(this,t,tinterp,(Value *)&local_1d8);
        if (bVar1) {
          TerminalAttributeValue::set_value(value,(Value *)&local_1d8);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ToTerminalAttributeValue");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x38);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)&ss_e,"Interpolate TimeSamples failed.");
          ::std::operator<<(poVar2,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        }
        if (local_1c8 != (undefined **)0x0) {
          (*(code *)local_1c8[4])(&local_1d8);
        }
        if (!bVar1) {
          return false;
        }
        return true;
      }
      return true;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ToTerminalAttributeValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x2e);
    ::std::operator<<(poVar2," ");
    pcVar3 = "[InternalError] Attribute is invalid.";
  }
  poVar2 = ::std::operator<<((ostream *)&ss_e,pcVar3);
  ::std::operator<<(poVar2,"\n");
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)err);
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  return false;
}

Assistant:

bool ToTerminalAttributeValue(
    const Attribute &attr, TerminalAttributeValue *value, std::string *err,
    const double t, const value::TimeSampleInterpolationType tinterp) {
  if (!value) {
    // ???
    return false;
  }

  if (attr.is_blocked()) {
    PUSH_ERROR_AND_RETURN("Attribute is None(Value Blocked).");
  }

  const primvar::PrimVar &var = attr.get_var();

  value->meta() = attr.metas();
  value->variability() = attr.variability();

  DCOUT("var has_default " << var.has_default());
  DCOUT("var has_timesamples " << var.has_default());
  DCOUT("var is_blocked " << var.is_blocked());
  DCOUT("var is_valid " << var.is_valid());

  if (!var.is_valid()) {
    PUSH_ERROR_AND_RETURN("[InternalError] Attribute is invalid.");
  } else if (var.is_scalar()) {
    const value::Value &v = var.value_raw();
    DCOUT("Attribute is scalar type:" << v.type_name());
    DCOUT("Attribute value = " << pprint_value(v));

    value->set_value(v);
  } else if (var.is_timesamples()) {
    value::Value v;
    if (!var.get_interpolated_value(t, tinterp, &v)) {
      PUSH_ERROR_AND_RETURN("Interpolate TimeSamples failed.");
      return false;
    }

    value->set_value(v);
  }

  return true;
}